

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

uint32 __thiscall Func::GetInstrCount(Func *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_30;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  uint instrCount;
  Func *this_local;
  
  __prevInstrCheck._4_4_ = 0;
  instrStop = (Instr *)0x0;
  local_30 = this->m_headInstr;
  do {
    if (local_30 == (Instr *)0x0) {
      return __prevInstrCheck._4_4_;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_30)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x4a1,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    instrStop = local_30;
    __prevInstrCheck._4_4_ = __prevInstrCheck._4_4_ + 1;
    local_30 = local_30->m_next;
  } while( true );
}

Assistant:

uint32
Func::GetInstrCount()
{
    uint instrCount = 0;

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instrCount++;
    }NEXT_INSTR_IN_FUNC;

    return instrCount;
}